

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_offsetof(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  bool bVar3;
  CTypeID CVar4;
  GCstr *name;
  CType *pCVar5;
  uint uVar6;
  CTState *cts;
  CTSize ofs;
  CTSize local_1c;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  cts->L = L;
  CVar4 = ffi_checkctype(L,cts,(TValue *)0x0);
  name = lj_lib_checkstr(L,2);
  do {
    uVar6 = CVar4;
    uVar1 = cts->tab[uVar6].info;
    CVar4 = uVar1 & 0xffff;
  } while ((uVar1 & 0xf0800000) == 0x20800000);
  if ((uVar1 & 0xf0000000) != 0x10000000) {
    return 0;
  }
  pCVar5 = cts->tab + uVar6;
  if (pCVar5->size == 0xffffffff) {
    return 0;
  }
  pCVar5 = lj_ctype_getfieldq(cts,pCVar5,name,&local_1c,(CTInfo *)0x0);
  if (pCVar5 == (CType *)0x0) {
LAB_0014edcc:
    bVar3 = true;
  }
  else {
    L->top[-1].n = (double)(int)local_1c;
    uVar1 = pCVar5->info;
    uVar6 = uVar1 >> 0x1c;
    if (uVar6 == 9) {
      pCVar5 = (CType *)0x1;
    }
    else {
      if (uVar6 != 10) goto LAB_0014edcc;
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pTVar2->n = (double)(uVar1 & 0x7f);
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pTVar2->n = (double)(pCVar5->info >> 8 & 0x7f);
      pCVar5 = (CType *)0x3;
    }
    bVar3 = false;
  }
  if (bVar3) {
    return 0;
  }
  return (int)pCVar5;
}

Assistant:

LJLIB_CF(ffi_offsetof)	LJLIB_REC(ffi_xof FF_ffi_offsetof)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  GCstr *name = lj_lib_checkstr(L, 2);
  CType *ct = lj_ctype_rawref(cts, id);
  CTSize ofs;
  if (ctype_isstruct(ct->info) && ct->size != CTSIZE_INVALID) {
    CType *fct = lj_ctype_getfield(cts, ct, name, &ofs);
    if (fct) {
      setintV(L->top-1, ofs);
      if (ctype_isfield(fct->info)) {
	return 1;
      } else if (ctype_isbitfield(fct->info)) {
	setintV(L->top++, ctype_bitpos(fct->info));
	setintV(L->top++, ctype_bitbsz(fct->info));
	return 3;
      }
    }
  }
  return 0;
}